

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# prim-types.hh
# Opt level: O3

optional<tinyusdz::value::quatf> * __thiscall
tinyusdz::XformOp::get_value<tinyusdz::value::quatf>
          (optional<tinyusdz::value::quatf> *__return_storage_ptr__,XformOp *this,double t,
          TimeSampleInterpolationType interp)

{
  bool bVar1;
  PrimVar *this_00;
  quatf value;
  optional<tinyusdz::value::quatf> local_34;
  
  this_00 = &this->_var;
  bVar1 = primvar::PrimVar::is_timesamples(this_00);
  if (bVar1) {
    bVar1 = primvar::PrimVar::get_interpolated_value<tinyusdz::value::quatf>
                      (this_00,t,interp,(quatf *)&local_34);
    if (!bVar1) {
      *(undefined8 *)&__return_storage_ptr__->contained = 0;
      *(undefined8 *)((long)&__return_storage_ptr__->contained + 8) = 0;
    }
    else {
      *(ulong *)&__return_storage_ptr__->contained =
           CONCAT44(local_34.contained.data.__align,local_34._0_4_);
      *(ulong *)((long)&__return_storage_ptr__->contained + 8) =
           CONCAT44(local_34.contained._8_4_,local_34.contained._4_4_);
    }
    __return_storage_ptr__->has_value_ = bVar1;
  }
  else {
    primvar::PrimVar::get_value<tinyusdz::value::quatf>(&local_34,this_00);
    __return_storage_ptr__->has_value_ = local_34.has_value_;
    if (local_34.has_value_ == true) {
      *(ulong *)&__return_storage_ptr__->contained =
           CONCAT44(local_34.contained._4_4_,local_34.contained.data.__align);
      *(ulong *)((long)&__return_storage_ptr__->contained + 8) =
           CONCAT44(local_34.contained._12_4_,local_34.contained._8_4_);
    }
  }
  return __return_storage_ptr__;
}

Assistant:

nonstd::optional<T> get_value(double t = value::TimeCode::Default(), 
          value::TimeSampleInterpolationType interp =
               value::TimeSampleInterpolationType::Linear) const {
    if (is_timesamples()) {
      T value;
      if (get_interpolated_value(&value, t, interp)) {
        return value;
      }
      return nonstd::nullopt;
    }

    return _var.get_value<T>();
  }